

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskFileIndex.cpp
# Opt level: O3

void __thiscall
OnDiskFileIndex::OnDiskFileIndex
          (OnDiskFileIndex *this,path *db_base,string *files_fname,string *cache_fname)

{
  pointer pcVar1;
  char cVar2;
  ulong uVar3;
  path __result;
  path local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  string *local_a8;
  string *local_a0;
  path *local_98;
  path local_90;
  string local_50;
  
  std::experimental::filesystem::v1::__cxx11::path::path(&this->db_base,db_base);
  local_b0 = &(this->files_fname).field_2;
  (this->files_fname)._M_dataplus._M_p = (pointer)local_b0;
  pcVar1 = (files_fname->_M_dataplus)._M_p;
  local_98 = &this->db_base;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->files_fname,pcVar1,pcVar1 + files_fname->_M_string_length);
  local_a8 = &this->cache_fname;
  local_b8 = &(this->cache_fname).field_2;
  (this->cache_fname)._M_dataplus._M_p = (pointer)local_b8;
  pcVar1 = (cache_fname->_M_dataplus)._M_p;
  local_a0 = &this->files_fname;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a8,pcVar1,pcVar1 + cache_fname->_M_string_length);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_90,files_fname)
  ;
  std::experimental::filesystem::v1::__cxx11::path::path(&local_f8,db_base);
  std::experimental::filesystem::v1::__cxx11::path::_M_append(&local_f8,&local_90._M_pathname);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_f8._M_pathname._M_dataplus._M_p,
             local_f8._M_pathname._M_dataplus._M_p + local_f8._M_pathname._M_string_length);
  RawFile::RawFile(&this->files_file,&local_50,0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_f8);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_90);
  (this->cache_file).super__Optional_base<RawFile,_false,_false>._M_payload.
  super__Optional_payload<RawFile,_true,_false,_false>.super__Optional_payload_base<RawFile>.
  _M_engaged = false;
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_90,cache_fname)
  ;
  std::experimental::filesystem::v1::__cxx11::path::path(&local_f8,db_base);
  std::experimental::filesystem::v1::__cxx11::path::_M_append(&local_f8,&local_90._M_pathname);
  cVar2 = std::experimental::filesystem::v1::status(&local_f8);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_f8);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_90);
  if ((cVar2 == '\0') || (cVar2 == -1)) {
    generate_namecache_file(this);
  }
  else {
    std::experimental::filesystem::v1::__cxx11::path::
    path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
              (&local_90,cache_fname);
    std::experimental::filesystem::v1::__cxx11::path::path(&local_f8,db_base);
    std::experimental::filesystem::v1::__cxx11::path::_M_append(&local_f8,&local_90._M_pathname);
    uVar3 = std::experimental::filesystem::v1::file_size(&local_f8);
    this->file_count = (uVar3 >> 3) - 1;
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_f8);
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_90);
  }
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_90,cache_fname)
  ;
  std::experimental::filesystem::v1::__cxx11::path::path(&local_f8,db_base);
  std::experimental::filesystem::v1::__cxx11::path::_M_append(&local_f8,&local_90._M_pathname);
  std::optional<RawFile>::emplace<std::experimental::filesystem::v1::__cxx11::path>
            (&this->cache_file,&local_f8);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_f8);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_90);
  return;
}

Assistant:

OnDiskFileIndex::OnDiskFileIndex(const fs::path &db_base,
                                 const std::string &files_fname,
                                 const std::string &cache_fname)
    : db_base(db_base),
      files_fname(files_fname),
      cache_fname(cache_fname),
      files_file(db_base / files_fname) {  // <- cool race condition here
    if (fs::exists(db_base / cache_fname)) {
        file_count = fs::file_size(db_base / cache_fname) / 8 - 1;
    } else {
        generate_namecache_file();
    }
    cache_file.emplace(db_base / cache_fname);
}